

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_elements_init_alloc
              (uint32_t version,size_t inputs_allocation_len,size_t outputs_allocation_len,
              size_t global_unknowns_allocation_len,wally_psbt **output)

{
  wally_psbt *pwVar1;
  int iVar2;
  
  iVar2 = wally_psbt_init_alloc
                    (version,inputs_allocation_len,outputs_allocation_len,
                     global_unknowns_allocation_len,output);
  if (iVar2 == 0) {
    pwVar1 = *output;
    pwVar1->magic[4] = 0xff;
    pwVar1->magic[0] = 'p';
    pwVar1->magic[1] = 's';
    pwVar1->magic[2] = 'e';
    pwVar1->magic[3] = 't';
  }
  return iVar2;
}

Assistant:

int wally_psbt_elements_init_alloc(
    uint32_t version,
    size_t inputs_allocation_len,
    size_t outputs_allocation_len,
    size_t global_unknowns_allocation_len,
    struct wally_psbt **output)
{
    int ret = wally_psbt_init_alloc(version, inputs_allocation_len,
                                    outputs_allocation_len,
                                    global_unknowns_allocation_len, output);
    if (ret == WALLY_OK)
        memcpy((*output)->magic, PSET_MAGIC, sizeof(PSET_MAGIC));

    return ret;
}